

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmodel.hpp
# Opt level: O1

bool __thiscall
QtMWidgets::ListModel<QImage>::moveRows
          (ListModel<QImage> *this,int sourceRow,int count,int destinationRow)

{
  ListModelPrivate<QImage> *pLVar1;
  long lVar2;
  int iVar3;
  long to;
  ulong uVar4;
  
  if (sourceRow != destinationRow) {
    if (0 < count) {
      uVar4 = 0;
      do {
        pLVar1 = (this->d).d;
        iVar3 = 0;
        if (destinationRow < sourceRow) {
          iVar3 = (int)uVar4;
        }
        lVar2 = (pLVar1->data).d.size;
        to = lVar2 + -1;
        if ((long)(uVar4 + (long)destinationRow) < lVar2) {
          to = uVar4 + (long)destinationRow;
        }
        QList<QImage>::move(&pLVar1->data,(long)(iVar3 + sourceRow),to);
        uVar4 = uVar4 + 1;
      } while ((uint)count != uVar4);
    }
    AbstractListModel::rowsMoved
              (&this->super_AbstractListModel,sourceRow,sourceRow + count + -1,destinationRow);
  }
  return sourceRow != destinationRow;
}

Assistant:

virtual bool moveRows( int sourceRow, int count, int destinationRow )
	{
		if( sourceRow == destinationRow )
			return false;

		for( int i = 0; i < count; ++i )
			d->data.move( sourceRow + ( sourceRow > destinationRow ? i : 0 ),
				( destinationRow + i < d->data.size() ? destinationRow + i : d->data.size() - 1 ) );

		emit rowsMoved( sourceRow, sourceRow + count - 1, destinationRow );

		return true;
	}